

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

void dtd_chain(DLword type)

{
  LispPTR LAddr;
  undefined6 in_register_0000003a;
  char *__s;
  LispPTR *pLVar1;
  
  pLVar1 = (LispPTR *)
           ((long)DTDspace +
           (CONCAT62(in_register_0000003a,type) & 0xffffffff) * 4 +
           (ulong)(uint)((int)CONCAT62(in_register_0000003a,type) << 5) + 8);
  __s = "That\'s All !";
  do {
    LAddr = *pLVar1;
    pLVar1 = NativeAligned4FromLAddr(LAddr);
    if (*pLVar1 == 0) {
LAB_0012ced6:
      puts(__s);
      return;
    }
    if ((*(ushort *)((ulong)(LAddr >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != type) {
      __s = "BAD cell in next dtdfree";
      goto LAB_0012ced6;
    }
    print(LAddr);
    putchar(10);
  } while( true );
}

Assistant:

void dtd_chain(DLword type) {
  struct dtd *dtdp;
  LispPTR next;
  LispPTR *next68k;

  dtdp = (struct dtd *)GetDTD(type);

  next = dtdp->dtd_free;
  next68k = (LispPTR *)NativeAligned4FromLAddr(next);

  while ((*next68k) != 0) {
    if (type != GetTypeNumber(next)) {
      printf("BAD cell in next dtdfree\n");
      return;
    }
    print(next);
    putchar('\n');

    next = *next68k;
    next68k = (LispPTR *)NativeAligned4FromLAddr(next);
  }
  printf("That's All !\n");

}